

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_props.cpp
# Opt level: O2

int32_t icu_63::ICU_Utility::parsePattern
                  (UnicodeString *rule,int32_t pos,int32_t limit,UnicodeString *pattern,
                  int32_t *parsedInts)

{
  short sVar1;
  UBool UVar2;
  char16_t cVar3;
  char16_t cVar4;
  int32_t iVar5;
  UChar32 UVar6;
  int32_t iVar7;
  int iVar8;
  int32_t i;
  int offset;
  int32_t pos_local;
  int32_t local_40;
  int32_t p;
  int32_t *local_38;
  
  iVar8 = 0;
  offset = 0;
  pos_local = pos;
  local_40 = limit;
  local_38 = parsedInts;
  while( true ) {
    sVar1 = (pattern->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar7 = (pattern->fUnion).fFields.fLength;
    }
    else {
      iVar7 = (int)sVar1 >> 5;
    }
    if (iVar7 <= offset) break;
    cVar3 = icu_63::UnicodeString::doCharAt(pattern,offset);
    iVar5 = pos_local;
    if (cVar3 == L'~') {
LAB_0035bdc1:
      pos_local = skipWhitespace(rule,&pos_local,'\0');
    }
    else if (cVar3 == L'#') {
      p = pos_local;
      iVar5 = parseInteger(rule,&p,local_40);
      local_38[iVar8] = iVar5;
      if (p == pos_local) break;
      iVar8 = iVar8 + 1;
      pos_local = p;
    }
    else {
      if (cVar3 == L' ') {
        if (pos_local < local_40) {
          pos_local = pos_local + 1;
          cVar3 = icu_63::UnicodeString::doCharAt(rule,iVar5);
          UVar2 = PatternProps::isWhiteSpace((uint)(ushort)cVar3);
          if (UVar2 != '\0') goto LAB_0035bdc1;
        }
        break;
      }
      if (local_40 <= pos_local) break;
      pos_local = pos_local + 1;
      cVar4 = icu_63::UnicodeString::doCharAt(rule,iVar5);
      UVar6 = u_tolower_63((uint)(ushort)cVar4);
      if (cVar3 != (char16_t)UVar6) break;
    }
    offset = offset + 1;
  }
  if (offset < iVar7) {
    pos_local = -1;
  }
  return pos_local;
}

Assistant:

int32_t ICU_Utility::parsePattern(const UnicodeString& rule, int32_t pos, int32_t limit,
                              const UnicodeString& pattern, int32_t* parsedInts) {
    // TODO Update this to handle surrogates
    int32_t p;
    int32_t intCount = 0; // number of integers parsed
    for (int32_t i=0; i<pattern.length(); ++i) {
        UChar cpat = pattern.charAt(i);
        UChar c;
        switch (cpat) {
        case 32 /*' '*/:
            if (pos >= limit) {
                return -1;
            }
            c = rule.charAt(pos++);
            if (!PatternProps::isWhiteSpace(c)) {
                return -1;
            }
            // FALL THROUGH to skipWhitespace
            U_FALLTHROUGH;
        case 126 /*'~'*/:
            pos = skipWhitespace(rule, pos);
            break;
        case 35 /*'#'*/:
            p = pos;
            parsedInts[intCount++] = parseInteger(rule, p, limit);
            if (p == pos) {
                // Syntax error; failed to parse integer
                return -1;
            }
            pos = p;
            break;
        default:
            if (pos >= limit) {
                return -1;
            }
            c = (UChar) u_tolower(rule.charAt(pos++));
            if (c != cpat) {
                return -1;
            }
            break;
        }
    }
    return pos;
}